

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O2

void anon_unknown.dwarf_388b1::equals1(void)

{
  allocator local_9a [2];
  string expected;
  string msg;
  
  msg._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  msg._M_string_length._0_4_ = 0x3e;
  UnitTests::Assert::Equals<char[6],char[6]>
            ((Assert *)&msg,(char (*) [6])"Hello",(char (*) [6])0x1114a7);
  expected._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
  ;
  expected._M_string_length._0_4_ = 0x3f;
  std::__cxx11::string::string((string *)&msg,"ASSERT_EQUALS should have fired here.",local_9a);
  UnitTests::Assert::Fail((Assert *)&expected,&msg);
}

Assistant:

TEST(assert_true1)
    {
        try
        {
            ASSERT_TRUE(1 == 2);
            FAIL("ASSERT_TRUE should have fired here.");
        }
        catch (UnitTests::TestFailure& e)
        {
            std::string msg      = e.what();
            std::string expected = "error A1000: Assertion failure :  Expression evaluated to false";
            if (msg.find(expected) == std::string::npos)
            {
                throw UnitTests::TestFailure("Unexpected message from ASSERT_TRUE", __FILE__, __LINE__);
            }
        }
    }